

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

skynet_context * skynet_context_release(skynet_context *ctx)

{
  int *piVar1;
  
  LOCK();
  piVar1 = &ctx->ref;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    if ((FILE *)ctx->logfile != (FILE *)0x0) {
      fclose((FILE *)ctx->logfile);
    }
    skynet_module_instance_release(ctx->mod,ctx->instance);
    skynet_mq_mark_release(ctx->queue);
    free(ctx);
    LOCK();
    G_NODE.total = G_NODE.total + -1;
    UNLOCK();
    ctx = (skynet_context *)0x0;
  }
  return ctx;
}

Assistant:

struct skynet_context * 
skynet_context_release(struct skynet_context *ctx) {
	if (ATOM_DEC(&ctx->ref) == 0) {
		delete_context(ctx);
		return NULL;
	}
	return ctx;
}